

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall PrintfTest_Pointer_Test::TestBody(PrintfTest_Pointer_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  bool bVar2;
  Message *pMVar3;
  char *pcVar4;
  basic_string_view<char> format_str;
  string_view format;
  basic_string_view<char> format_str_00;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  basic_string_view<char> format_str_01;
  string_view format_05;
  basic_string_view<char> format_str_02;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  basic_string_view<wchar_t> format_str_03;
  wstring_view format_09;
  basic_string_view<wchar_t> format_str_04;
  wstring_view format_10;
  wstring_view format_11;
  wstring_view format_12;
  wstring_view format_13;
  wstring_view format_14;
  basic_string_view<wchar_t> format_str_05;
  wstring_view format_15;
  basic_string_view<wchar_t> format_str_06;
  wstring_view format_16;
  wstring_view format_17;
  wstring_view format_18;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_06;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_3;
  void *p;
  wchar_t *null_wstr;
  wchar_t *w;
  char *s;
  int n;
  char *null_str;
  wstring local_918;
  undefined1 local_8f8 [32];
  unsigned_long_long local_8d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>_2
  local_8d0;
  locale_ref local_8c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_8b8;
  wchar_t *local_898;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_890 [2];
  pointer local_880;
  wchar_t *local_878;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_870;
  _Alloc_hider local_868;
  undefined8 *puStack_860;
  wchar_t local_858 [6];
  wchar_t *local_840;
  wchar_t *local_838;
  wchar_t local_82c;
  wchar_t *local_828;
  wstring local_820;
  undefined1 local_800 [2000];
  
  local_8b8._M_dataplus._M_p = &local_82c;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  format_str.size_ = 2;
  format_str.data_ = "{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_8b8;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
                ::TYPES;
  local_880 = local_8b8._M_dataplus._M_p;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_820,format_str,args,(locale_ref)0x0);
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f8,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format.size_ = 2;
  format.data_ = "%p";
  test_sprintf<void*>((string *)&local_820,format,&local_880);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_918,"fmt::format(\"{}\", p)","test_sprintf(\"%p\", p)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_);
  }
  if ((char)local_918._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"%p",2);
    if ((undefined8 *)local_918._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_918._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_918._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8f8._0_8_ = local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  format_str_00.size_ = 2;
  format_str_00.data_ = "{}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_8f8;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
       ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_820,format_str_00,args_00,(locale_ref)0x0);
  paVar1 = &local_8b8.field_2;
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format_00.size_ = 2;
  format_00.data_ = "%p";
  make_positional_abi_cxx11_((string *)&local_868,format_00);
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_898;
  local_898 = local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_868._M_p;
  local_8f8._8_8_ = puStack_860;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,void*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = (basic_buffer<char> *)&local_820;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_8f8);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_918,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_878,"fmt::format(\"{}\", p)",
             "fmt::sprintf(make_positional(\"%p\"), p)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_918);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if ((wchar_t *)local_868._M_p != local_858) {
    operator_delete(local_868._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if (local_878._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_870.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_870.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_870,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_880 = (wchar_t *)0x0;
  format_01.size_ = 2;
  format_01.data_ = "%p";
  test_sprintf<void*>((string *)&local_820,format_01,&local_880);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)local_8f8,"\"(nil)\"","test_sprintf(\"%p\", p)",(char (*) [6])0x205882,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_8f8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"%p",2);
    if ((undefined8 *)local_8f8._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_8f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8b8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_8f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_02.size_ = 2;
  format_02.data_ = "%p";
  make_positional_abi_cxx11_((string *)&local_918,format_02);
  local_868._M_p = (pointer)local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_918._M_dataplus._M_p;
  local_8f8._8_8_ = local_918._M_string_length;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,void*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = &local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_868;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_8f8);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_898,"\"(nil)\"","fmt::sprintf(make_positional(\"%p\"), p)",
             (char (*) [6])0x205882,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_890[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_890[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_03.size_ = 4;
  format_03.data_ = "%10p";
  test_sprintf<void*>((string *)&local_820,format_03,&local_880);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)local_8f8,"\"     (nil)\"","test_sprintf(\"%10p\", p)",
             (char (*) [11])"     (nil)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_8f8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"%10p",4);
    if ((undefined8 *)local_8f8._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_8f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8b8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_8f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_04.size_ = 4;
  format_04.data_ = "%10p";
  make_positional_abi_cxx11_((string *)&local_918,format_04);
  local_868._M_p = (pointer)local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_918._M_dataplus._M_p;
  local_8f8._8_8_ = local_918._M_string_length;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,void*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = &local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_868;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_8f8);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_898,"\"     (nil)\"","fmt::sprintf(make_positional(\"%10p\"), p)",
             (char (*) [11])"     (nil)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_890[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_890[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_838 = L"test";
  local_8b8._M_dataplus._M_p = L"test";
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  format_str_01.size_ = 4;
  format_str_01.data_ = "{:p}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_8b8;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_820,format_str_01,args_01,(locale_ref)0x0);
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f8,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format_05.size_ = 2;
  format_05.data_ = "%p";
  test_sprintf<char_const*>((string *)&local_820,format_05,(char **)&local_838);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_918,"fmt::format(\"{:p}\", s)","test_sprintf(\"%p\", s)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_);
  }
  if ((char)local_918._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"%p",2);
    if ((undefined8 *)local_918._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_918._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_918._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8f8._0_8_ = local_838;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  format_str_02.size_ = 4;
  format_str_02.data_ = "{:p}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_8f8;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_820,format_str_02,args_02,(locale_ref)0x0);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format_06.size_ = 2;
  format_06.data_ = "%p";
  make_positional_abi_cxx11_((string *)&local_868,format_06);
  local_898 = local_838;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_868._M_p;
  local_8f8._8_8_ = puStack_860;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char_const*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = (basic_buffer<char> *)&local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_898;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_8f8);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_918,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_878,"fmt::format(\"{:p}\", s)",
             "fmt::sprintf(make_positional(\"%p\"), s)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_918);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if ((wchar_t *)local_868._M_p != local_858) {
    operator_delete(local_868._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if (local_878._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_870.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_870.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_870,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_828 = (wchar_t *)0x0;
  format_07.size_ = 2;
  format_07.data_ = "%p";
  test_sprintf<char_const*>((string *)&local_820,format_07,(char **)&local_828);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)local_8f8,"\"(nil)\"","test_sprintf(\"%p\", null_str)",
             (char (*) [6])0x205882,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_8f8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"%p",2);
    if ((undefined8 *)local_8f8._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_8f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1cb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8b8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_8f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_08.size_ = 2;
  format_08.data_ = "%p";
  make_positional_abi_cxx11_((string *)&local_918,format_08);
  local_868._M_p = (pointer)local_828;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_918._M_dataplus._M_p;
  local_8f8._8_8_ = local_918._M_string_length;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char_const*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = &local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_868;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_8f8);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,local_820._M_string_length,
             (undefined1 *)(local_820._M_string_length + local_820.field_2._M_allocated_capacity));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023bf40;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_898,"\"(nil)\"","fmt::sprintf(make_positional(\"%p\"), null_str)",
             (char (*) [6])0x205882,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_890[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_890[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1cb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  format_str_03.size_ = 2;
  format_str_03.data_ = L"{}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_8b8;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,void*>
       ::TYPES;
  local_8b8._M_dataplus._M_p = &local_82c;
  local_880 = &local_82c;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str_03,args_03,(locale_ref)0x0);
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_8f8,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format_09.size_ = 2;
  format_09.data_ = L"%p";
  test_sprintf<void*>(&local_820,format_09,&local_880);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&local_918,"fmt::format(L\"{}\", p)","test_sprintf(L\"%p\", p)",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_8f8
             ,&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_);
  }
  if ((char)local_918._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    pMVar3 = testing::Message::operator<<((Message *)&local_820,L"%p");
    if ((undefined8 *)local_918._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_918._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ce,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_918._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8f8._0_8_ = local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  format_str_04.size_ = 2;
  format_str_04.data_ = L"{}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_8f8;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,void*>
       ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str_04,args_04,(locale_ref)0x0);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_8b8,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format_10.size_ = 2;
  format_10.data_ = L"%p";
  make_positional_abi_cxx11_((wstring *)&local_868,format_10);
  local_898 = local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_868._M_p;
  local_8f8._8_8_ = puStack_860;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>,void*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = (basic_buffer<wchar_t> *)&local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_898;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
            *)local_8f8);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_918,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&local_878,"fmt::format(L\"{}\", p)",
             "fmt::sprintf(make_positional(L\"%p\"), p)",&local_8b8,&local_918);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if ((wchar_t *)local_868._M_p != local_858) {
    operator_delete(local_868._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if (local_878._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_870.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_870.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ce,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_870,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_880 = (wchar_t *)0x0;
  format_11.size_ = 2;
  format_11.data_ = L"%p";
  test_sprintf<void*>(&local_820,format_11,&local_880);
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)local_8f8,"L\"(nil)\"","test_sprintf(L\"%p\", p)",(wchar_t (*) [6])0x2064e4
             ,&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_8f8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    pMVar3 = testing::Message::operator<<((Message *)&local_820,L"%p");
    if ((undefined8 *)local_8f8._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_8f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8b8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_8f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_12.size_ = 2;
  format_12.data_ = L"%p";
  make_positional_abi_cxx11_(&local_918,format_12);
  local_868._M_p = (pointer)local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_918._M_dataplus._M_p;
  local_8f8._8_8_ = local_918._M_string_length;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>,void*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = &local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_868;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
            *)local_8f8);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_8b8,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)&local_898,"L\"(nil)\"","fmt::sprintf(make_positional(L\"%p\"), p)",
             (wchar_t (*) [6])0x2064e4,&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_890[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_890[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_13.size_ = 4;
  format_13.data_ = L"%10p";
  test_sprintf<void*>(&local_820,format_13,&local_880);
  testing::internal::CmpHelperEQ<wchar_t[11],std::__cxx11::wstring>
            ((internal *)local_8f8,"L\"     (nil)\"","test_sprintf(L\"%10p\", p)",
             (wchar_t (*) [11])L"     (nil)",&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_8f8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    pMVar3 = testing::Message::operator<<((Message *)&local_820,L"%10p");
    if ((undefined8 *)local_8f8._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_8f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8b8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_8f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_14.size_ = 4;
  format_14.data_ = L"%10p";
  make_positional_abi_cxx11_(&local_918,format_14);
  local_868._M_p = (pointer)local_880;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_918._M_dataplus._M_p;
  local_8f8._8_8_ = local_918._M_string_length;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>,void*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = &local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_868;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
            *)local_8f8);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_8b8,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<wchar_t[11],std::__cxx11::wstring>
            ((internal *)&local_898,"L\"     (nil)\"","fmt::sprintf(make_positional(L\"%10p\"), p)",
             (wchar_t (*) [11])L"     (nil)",&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_890[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_890[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_840 = L"test";
  local_8b8._M_dataplus._M_p = L"test";
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  format_str_05.size_ = 4;
  format_str_05.data_ = L"{:p}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_8b8;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t_const*>
       ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str_05,args_05,(locale_ref)0x0);
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_8f8,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format_15.size_ = 2;
  format_15.data_ = L"%p";
  test_sprintf<wchar_t_const*>(&local_820,format_15,&local_840);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&local_918,"fmt::format(L\"{:p}\", w)","test_sprintf(L\"%p\", w)",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_8f8
             ,&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_);
  }
  if ((char)local_918._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    pMVar3 = testing::Message::operator<<((Message *)&local_820,L"%p");
    if ((undefined8 *)local_918._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_918._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_918._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8f8._0_8_ = local_840;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  format_str_06.size_ = 4;
  format_str_06.data_ = L"{:p}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_8f8;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t_const*>
       ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str_06,args_06,(locale_ref)0x0);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_8b8,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  format_16.size_ = 2;
  format_16.data_ = L"%p";
  make_positional_abi_cxx11_((wstring *)&local_868,format_16);
  local_898 = local_840;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_868._M_p;
  local_8f8._8_8_ = puStack_860;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>,wchar_t_const*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = (basic_buffer<wchar_t> *)&local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_898;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
            *)local_8f8);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_918,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&local_878,"fmt::format(L\"{:p}\", w)",
             "fmt::sprintf(make_positional(L\"%p\"), w)",&local_8b8,&local_918);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if ((wchar_t *)local_868._M_p != local_858) {
    operator_delete(local_868._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if (local_878._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_870.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_870.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_870,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_878 = (wchar_t *)0x0;
  format_17.size_ = 2;
  format_17.data_ = L"%p";
  test_sprintf<wchar_t_const*>(&local_820,format_17,&local_878);
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)local_8f8,"L\"(nil)\"","test_sprintf(L\"%p\", null_wstr)",
             (wchar_t (*) [6])0x2064e4,&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_8f8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_820._M_dataplus._M_p + 4),"format: ",8);
    pMVar3 = testing::Message::operator<<((Message *)&local_820,L"%p");
    if ((undefined8 *)local_8f8._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_8f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8b8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_8f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_18.size_ = 2;
  format_18.data_ = L"%p";
  make_positional_abi_cxx11_(&local_918,format_18);
  local_868._M_p = (pointer)local_878;
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  local_820.field_2._8_8_ = 500;
  local_8f8._0_8_ = local_918._M_dataplus._M_p;
  local_8f8._8_8_ = local_918._M_string_length;
  local_8f8._16_4_ = L'\0';
  local_8d8 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>,wchar_t_const*>
              ::TYPES;
  local_8c8.locale_ = (void *)0x0;
  local_8f8._24_8_ = &local_820;
  local_8d0.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)&local_868;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
            *)local_8f8);
  local_8b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_8b8,local_820._M_string_length,
             (undefined1 *)
             (local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4));
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_0023c000;
  if ((undefined1 *)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)&local_898,"L\"(nil)\"","fmt::sprintf(make_positional(L\"%p\"), null_wstr)"
             ,(wchar_t (*) [6])0x2064e4,&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_890[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_890[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_8f8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_8f8);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(PrintfTest, Pointer) {
  int n;
  void *p = &n;
  EXPECT_PRINTF(fmt::format("{}", p), "%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", p);
  EXPECT_PRINTF("     (nil)", "%10p", p);
  const char *s = "test";
  EXPECT_PRINTF(fmt::format("{:p}", s), "%p", s);
  const char *null_str = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", null_str);

  p = &n;
  EXPECT_PRINTF(fmt::format(L"{}", p), L"%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", p);
  EXPECT_PRINTF(L"     (nil)", L"%10p", p);
  const wchar_t *w = L"test";
  EXPECT_PRINTF(fmt::format(L"{:p}", w), L"%p", w);
  const wchar_t *null_wstr = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", null_wstr);
}